

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QPostEvent>::reallocateAndGrow
          (QArrayDataPointer<QPostEvent> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QPostEvent> *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  QPostEvent *pQVar3;
  undefined1 *puVar4;
  bool bVar5;
  QEvent *pQVar6;
  undefined4 uVar7;
  QPostEvent *pQVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<QPostEvent> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QPostEvent> *)0x0 && where == GrowsAtEnd) {
    pDVar1 = this->d;
    if (pDVar1 == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pDVar1 == (Data *)0x0) {
        lVar10 = 0;
        lVar9 = 0;
      }
      else {
        lVar10 = (pDVar1->super_QArrayData).alloc;
        lVar9 = (this->size - (pDVar1->super_QArrayData).alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 3) * -0x5555555555555555;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::QMovableArrayOps<QPostEvent>::reallocate
                  ((QMovableArrayOps<QPostEvent> *)this,lVar10 + n + lVar9,Grow);
        return;
      }
      goto LAB_0027e16f;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QPostEvent *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (QPostEvent *)0x0)) {
    if (this->size != 0) {
      lVar10 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      pQVar8 = this->ptr;
      pQVar3 = pQVar8 + lVar10;
      if ((old != (QArrayDataPointer<QPostEvent> *)0x0) || (bVar5)) {
        if ((lVar10 != 0) && (0 < lVar10)) {
          do {
            uVar7 = *(undefined4 *)&pQVar8->field_0x14;
            local_38.ptr[local_38.size].priority = pQVar8->priority;
            *(undefined4 *)&local_38.ptr[local_38.size].field_0x14 = uVar7;
            pQVar6 = pQVar8->event;
            local_38.ptr[local_38.size].receiver = pQVar8->receiver;
            local_38.ptr[local_38.size].event = pQVar6;
            pQVar8 = pQVar8 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar8 < pQVar3);
        }
      }
      else if ((lVar10 != 0) && (0 < lVar10)) {
        do {
          uVar7 = *(undefined4 *)&pQVar8->field_0x14;
          local_38.ptr[local_38.size].priority = pQVar8->priority;
          *(undefined4 *)&local_38.ptr[local_38.size].field_0x14 = uVar7;
          pQVar6 = pQVar8->event;
          local_38.ptr[local_38.size].receiver = pQVar8->receiver;
          local_38.ptr[local_38.size].event = pQVar6;
          pQVar8 = pQVar8 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar8 < pQVar3);
      }
    }
    pQVar2 = &this->d->super_QArrayData;
    pQVar3 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar4 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar2;
    local_38.ptr = pQVar3;
    local_38.size = (qsizetype)puVar4;
    if (old != (QArrayDataPointer<QPostEvent> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = (Data *)pQVar2;
      old->ptr = pQVar3;
      local_38.size = old->size;
      old->size = (qsizetype)puVar4;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x18,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
LAB_0027e16f:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }